

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_barrier.hpp
# Opt level: O3

void __thiscall
yamc::barrier<yamc::detail::default_barrier_completion>::arrive_and_drop
          (barrier<yamc::detail::default_barrier_completion> *this)

{
  uint uVar1;
  long lVar2;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->mtx_;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if (this->counter_ < 1) {
    __assert_fail("0 < counter_",
                  "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_barrier.hpp"
                  ,0x8e,
                  "void yamc::barrier<>::arrive_and_drop() [CompletionFunction = yamc::detail::default_barrier_completion]"
                 );
  }
  uVar1 = this->phase_;
  lVar2 = this->counter_ + -1;
  this->counter_ = lVar2;
  if (lVar2 == 0) {
    lVar2 = this->init_count_ + -1;
    this->init_count_ = lVar2;
    this->counter_ = lVar2;
    this->phase_ = uVar1 + 1;
    std::condition_variable::notify_all();
    if (uVar1 < this->phase_) goto LAB_0012f8ba;
  }
  do {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  } while (this->phase_ <= uVar1);
LAB_0012f8ba:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void arrive_and_drop()
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    assert(0 < counter_);
    auto arrival_phase = phase_;
    counter_ -= 1;
    if (counter_ == 0) {
      phase_completion_step(true);
    }
    while (phase_ <= arrival_phase) {
      cv_.wait(lk);
    }
  }